

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

size_t ssh2_stdin_backlog(ConnectionLayer *cl)

{
  ConnectionLayerVtable *pCVar1;
  size_t sVar2;
  size_t sVar3;
  ConnectionLayer *local_30;
  ssh2_channel *c;
  ssh2_connection_state *s;
  ConnectionLayer *cl_local;
  
  if (cl[-0xc].logctx == (LogContext *)0x0) {
    cl_local = (ConnectionLayer *)0x0;
  }
  else {
    pCVar1 = cl[-0xc].vt;
    if (cl[-0xc].logctx == (LogContext *)0x0) {
      local_30 = (ConnectionLayer *)0x0;
    }
    else {
      sVar2 = bufchain_size((bufchain *)&pCVar1[-1].add_sharing_x11_display);
      sVar3 = bufchain_size((bufchain *)&pCVar1[-1].sharing_queue_global_request);
      local_30 = (ConnectionLayer *)(sVar2 + sVar3);
    }
    cl_local = local_30;
  }
  return (size_t)cl_local;
}

Assistant:

static size_t ssh2_stdin_backlog(ConnectionLayer *cl)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    struct ssh2_channel *c;

    if (!s->mainchan)
        return 0;
    c = container_of(s->mainchan_sc, struct ssh2_channel, sc);
    return s->mainchan ?
        bufchain_size(&c->outbuffer) + bufchain_size(&c->errbuffer) : 0;
}